

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::FunctionScope::FunctionScope
          (FunctionScope *this,Function *function,Literals *arguments,ModuleRunner *parent)

{
  size_t *psVar1;
  pointer pLVar2;
  char cVar3;
  size_t sVar4;
  size_type __new_size;
  ulong uVar5;
  Type *pTVar6;
  ostream *poVar7;
  Type TVar8;
  ulong i;
  long lVar9;
  long lVar10;
  Name name;
  Name name_00;
  initializer_list<wasm::Literal> init;
  Literal local_a8;
  Type local_90 [7];
  Type local_58;
  Type params;
  
  (this->locals).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->locals).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->locals).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->function = function;
  this->parent = parent;
  (this->currDelegateTarget).super_IString.str._M_len = 0;
  (this->currDelegateTarget).super_IString.str._M_str = (char *)0x0;
  this->oldScope = (parent->super_ModuleRunnerBase<wasm::ModuleRunner>).scope;
  (parent->super_ModuleRunnerBase<wasm::ModuleRunner>).scope = this;
  psVar1 = &(parent->super_ModuleRunnerBase<wasm::ModuleRunner>).callDepth;
  *psVar1 = *psVar1 + 1;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&(parent->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack,
             (value_type *)function);
  local_90[0].id = ::wasm::HeapType::getSignature();
  sVar4 = Type::size(local_90);
  if (sVar4 != ((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18 +
               (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Function `");
    name_00.super_IString.str._M_str = (char *)function;
    name_00.super_IString.str._M_len =
         (size_t)(function->super_Importable).super_Named.name.super_IString.str._M_str;
    poVar7 = wasm::operator<<((wasm *)poVar7,
                              (ostream *)
                              (function->super_Importable).super_Named.name.super_IString.str._M_len
                              ,name_00);
    poVar7 = std::operator<<(poVar7,"` expects ");
    local_90[0].id = ::wasm::HeapType::getSignature();
    Type::size(local_90);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," parameters, got ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," arguments.");
    std::endl<char,std::char_traits<char>>(poVar7);
    ::wasm::handle_unreachable
              ("invalid param count",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0xc8b);
  }
  __new_size = ::wasm::Function::getNumLocals();
  std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::resize(&this->locals,__new_size);
  local_58.id = ::wasm::HeapType::getSignature();
  params.id = (uintptr_t)&(arguments->super_SmallVector<wasm::Literal,_1UL>).fixed;
  lVar10 = -0x18;
  lVar9 = 0;
  i = 0;
  do {
    uVar5 = ::wasm::Function::getNumLocals();
    if (uVar5 <= i) {
      return;
    }
    pLVar2 = (arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (i < ((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pLVar2) / 0x18 +
            (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed) {
      TVar8.id = (uintptr_t)((pLVar2->field_0).v128 + lVar10);
      if (i == 0) {
        TVar8 = params;
      }
      TVar8.id = *(uintptr_t *)(TVar8.id + 0x10);
      pTVar6 = Type::operator[](&local_58,i);
      cVar3 = ::wasm::Type::isSubType(TVar8,(Type)pTVar6->id);
      if (cVar3 == '\0') {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Function `");
        name.super_IString.str._M_str = (char *)function;
        name.super_IString.str._M_len =
             (size_t)(function->super_Importable).super_Named.name.super_IString.str._M_str;
        poVar7 = wasm::operator<<((wasm *)poVar7,
                                  (ostream *)
                                  (function->super_Importable).super_Named.name.super_IString.str.
                                  _M_len,name);
        poVar7 = std::operator<<(poVar7,"` expects type ");
        pTVar6 = Type::operator[](&local_58,i);
        poVar7 = (ostream *)::wasm::operator<<(poVar7,(Type)pTVar6->id);
        poVar7 = std::operator<<(poVar7," for parameter ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7,", got ");
        TVar8.id = (uintptr_t)
                   ((((arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start)->field_0).v128 + lVar10);
        if (i == 0) {
          TVar8 = params;
        }
        poVar7 = (ostream *)::wasm::operator<<(poVar7,(Type)*(uintptr_t *)(TVar8.id + 0x10));
        poVar7 = std::operator<<(poVar7,".");
        std::endl<char,std::char_traits<char>>(poVar7);
        ::wasm::handle_unreachable
                  ("invalid param count",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xc95);
      }
      TVar8.id = (uintptr_t)
                 ((long)&((arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start)->field_0 + lVar10);
      if (i == 0) {
        TVar8 = params;
      }
      ::wasm::Literal::Literal(&local_a8,(Literal *)TVar8.id);
      init._M_len = 1;
      init._M_array = &local_a8;
      Literals::Literals((Literals *)local_90,init);
      SmallVector<wasm::Literal,_1UL>::operator=
                ((SmallVector<wasm::Literal,_1UL> *)
                 ((long)&(((this->locals).
                           super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
                           _M_impl.super__Vector_impl_data._M_start)->
                         super_SmallVector<wasm::Literal,_1UL>).fixed + lVar9 + 0xfffffffffffffff8U)
                 ,(SmallVector<wasm::Literal,_1UL> *)local_90);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_90);
      ::wasm::Literal::~Literal(&local_a8);
    }
    else {
      cVar3 = ::wasm::Function::isVar((uint)function);
      if (cVar3 == '\0') {
        __assert_fail("function->isVar(i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0xc99,
                      "wasm::ModuleRunnerBase<wasm::ModuleRunner>::FunctionScope::FunctionScope(Function *, const Literals &, SubType &) [SubType = wasm::ModuleRunner]"
                     );
      }
      ::wasm::Function::getLocalType((uint)function);
      ::wasm::Literal::makeZeros((Type)local_90);
      SmallVector<wasm::Literal,_1UL>::operator=
                ((SmallVector<wasm::Literal,_1UL> *)
                 ((long)&(((this->locals).
                           super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
                           _M_impl.super__Vector_impl_data._M_start)->
                         super_SmallVector<wasm::Literal,_1UL>).fixed + lVar9 + 0xfffffffffffffff8U)
                 ,(SmallVector<wasm::Literal,_1UL> *)local_90);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_90);
    }
    i = i + 1;
    lVar10 = lVar10 + 0x18;
    lVar9 = lVar9 + 0x38;
  } while( true );
}

Assistant:

FunctionScope(Function* function,
                  const Literals& arguments,
                  SubType& parent)
      : function(function), parent(parent) {
      oldScope = parent.scope;
      parent.scope = this;
      parent.callDepth++;
      parent.functionStack.push_back(function->name);

      if (function->getParams().size() != arguments.size()) {
        std::cerr << "Function `" << function->name << "` expects "
                  << function->getParams().size() << " parameters, got "
                  << arguments.size() << " arguments." << std::endl;
        WASM_UNREACHABLE("invalid param count");
      }
      locals.resize(function->getNumLocals());
      Type params = function->getParams();
      for (size_t i = 0; i < function->getNumLocals(); i++) {
        if (i < arguments.size()) {
          if (!Type::isSubType(arguments[i].type, params[i])) {
            std::cerr << "Function `" << function->name << "` expects type "
                      << params[i] << " for parameter " << i << ", got "
                      << arguments[i].type << "." << std::endl;
            WASM_UNREACHABLE("invalid param count");
          }
          locals[i] = {arguments[i]};
        } else {
          assert(function->isVar(i));
          locals[i] = Literal::makeZeros(function->getLocalType(i));
        }
      }
    }